

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O3

bool __thiscall
slang::parsing::Preprocessor::expandReplacementList
          (Preprocessor *this,span<const_slang::parsing::Token,_18446744073709551615UL> *tokens,
          SmallSet<const_slang::syntax::DefineDirectiveSyntax_*,_8UL,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
          *alreadyExpanded)

{
  char *pcVar1;
  byte bVar2;
  undefined4 uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Token TVar8;
  bool bVar9;
  SyntaxKind SVar10;
  int iVar11;
  MacroActualArgumentListSyntax *actualArgs;
  ulong uVar12;
  undefined4 extraout_var;
  SourceLocation location;
  Diagnostic *this_00;
  uint uVar13;
  Info *pIVar14;
  size_t extraout_RDX;
  DefineDirectiveSyntax *pDVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  byte bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  MacroDef MVar27;
  string_view arg;
  span<const_slang::parsing::Token,_18446744073709551615UL> expanded;
  SmallVector<slang::parsing::Token,_16UL> expansionBuffer;
  SmallVector<slang::parsing::Token,_16UL> outBuffer;
  Token local_348;
  DefineDirectiveSyntax *local_338;
  MacroIntrinsic local_330;
  undefined2 uStack_32c;
  undefined2 uStack_32a;
  table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
  *local_328;
  ulong local_320;
  long local_318;
  arrays_type *local_310;
  span<const_slang::parsing::Token,_18446744073709551615UL> *local_308;
  undefined1 local_300 [24];
  char local_2e8;
  char cStack_2e7;
  char cStack_2e6;
  byte bStack_2e5;
  char cStack_2e4;
  char cStack_2e3;
  char cStack_2e2;
  byte bStack_2e1;
  char cStack_2e0;
  char cStack_2df;
  char cStack_2de;
  byte bStack_2dd;
  char cStack_2dc;
  char cStack_2db;
  char cStack_2da;
  byte bStack_2d9;
  char local_2d8;
  char cStack_2d7;
  char cStack_2d6;
  byte bStack_2d5;
  char cStack_2d4;
  char cStack_2d3;
  char cStack_2d2;
  byte bStack_2d1;
  char cStack_2d0;
  char cStack_2cf;
  char cStack_2ce;
  byte bStack_2cd;
  char cStack_2cc;
  char cStack_2cb;
  char cStack_2ca;
  byte bStack_2c9;
  char local_2c8;
  char cStack_2c7;
  char cStack_2c6;
  byte bStack_2c5;
  char cStack_2c4;
  char cStack_2c3;
  char cStack_2c2;
  byte bStack_2c1;
  char cStack_2c0;
  char cStack_2bf;
  char cStack_2be;
  byte bStack_2bd;
  char cStack_2bc;
  char cStack_2bb;
  char cStack_2ba;
  byte bStack_2b9;
  MacroParser local_2b8;
  MacroExpansion local_298;
  SmallVectorBase<slang::parsing::Token> local_260 [7];
  SmallVectorBase<slang::parsing::Token> local_148 [7];
  
  local_148[0].data_ = (pointer)local_148[0].firstElement;
  local_148[0].len = 0;
  local_148[0].cap = 0x10;
  local_260[0].data_ = (pointer)local_260[0].firstElement;
  local_260[0].len = 0;
  local_260[0].cap = 0x10;
  local_2b8.buffer._M_ptr = tokens->_M_ptr;
  local_2b8.buffer._M_extent._M_extent_value = (tokens->_M_extent)._M_extent_value;
  local_2b8.currentIndex = 0;
  local_308 = tokens;
  local_2b8.pp = this;
  Token::Token(&local_348);
  local_310 = (arrays_type *)&alreadyExpanded->field_0x50;
  local_328 = (table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
               *)&(alreadyExpanded->super_Storage).field_0x48;
  bVar9 = false;
  while( true ) {
    local_348 = MacroParser::next(&local_2b8);
    pIVar14 = local_348.info;
    if (pIVar14 == (Info *)0x0) break;
    if ((local_348.kind == Directive) &&
       (SVar10 = Token::directiveKind(&local_348), SVar10 == MacroUsage)) {
      MVar27 = findMacro(this,local_348);
      local_338 = MVar27.syntax;
      local_330 = MVar27.intrinsic;
      uStack_32c = MVar27._12_2_;
      if ((local_338 == (DefineDirectiveSyntax *)0x0) && (local_330 == None)) {
        SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                  (local_148,&local_348);
      }
      else {
        if (local_330 == None) {
          auVar5._8_8_ = 0;
          auVar5._0_8_ = local_338;
          uVar12 = SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                   SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),0);
          uVar19 = uVar12 >> (alreadyExpanded->field_0x50 & 0x3f);
          uVar3 = (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    match_word(unsigned_long)::word)[uVar12 & 0xff];
          uVar16 = 0;
          do {
            pcVar1 = (char *)(*(long *)&alreadyExpanded->field_0x60 + uVar19 * 0x10);
            local_2c8 = *pcVar1;
            cStack_2c7 = pcVar1[1];
            cStack_2c6 = pcVar1[2];
            bStack_2c5 = pcVar1[3];
            cStack_2c4 = pcVar1[4];
            cStack_2c3 = pcVar1[5];
            cStack_2c2 = pcVar1[6];
            bStack_2c1 = pcVar1[7];
            cStack_2c0 = pcVar1[8];
            cStack_2bf = pcVar1[9];
            cStack_2be = pcVar1[10];
            bStack_2bd = pcVar1[0xb];
            cStack_2bc = pcVar1[0xc];
            cStack_2bb = pcVar1[0xd];
            cStack_2ba = pcVar1[0xe];
            bStack_2b9 = pcVar1[0xf];
            cVar20 = (char)uVar3;
            auVar24[0] = -(local_2c8 == cVar20);
            cVar21 = (char)((uint)uVar3 >> 8);
            auVar24[1] = -(cStack_2c7 == cVar21);
            cVar22 = (char)((uint)uVar3 >> 0x10);
            auVar24[2] = -(cStack_2c6 == cVar22);
            bVar23 = (byte)((uint)uVar3 >> 0x18);
            auVar24[3] = -(bStack_2c5 == bVar23);
            auVar24[4] = -(cStack_2c4 == cVar20);
            auVar24[5] = -(cStack_2c3 == cVar21);
            auVar24[6] = -(cStack_2c2 == cVar22);
            auVar24[7] = -(bStack_2c1 == bVar23);
            auVar24[8] = -(cStack_2c0 == cVar20);
            auVar24[9] = -(cStack_2bf == cVar21);
            auVar24[10] = -(cStack_2be == cVar22);
            auVar24[0xb] = -(bStack_2bd == bVar23);
            auVar24[0xc] = -(cStack_2bc == cVar20);
            auVar24[0xd] = -(cStack_2bb == cVar21);
            auVar24[0xe] = -(cStack_2ba == cVar22);
            auVar24[0xf] = -(bStack_2b9 == bVar23);
            uVar13 = (uint)(ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe);
            if (uVar13 != 0) {
              do {
                uVar4 = 0;
                if (uVar13 != 0) {
                  for (; (uVar13 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                  }
                }
                if (local_338 ==
                    *(DefineDirectiveSyntax **)
                     (*(long *)&alreadyExpanded->field_0x68 + uVar19 * 0x78 + (ulong)uVar4 * 8)) {
                  location = Token::location(&local_348);
                  this_00 = addDiag(this,(DiagCode)0x150004,location);
                  arg = Token::valueText(&local_348);
                  Diagnostic::operator<<(this_00,arg);
                  goto LAB_00287dcd;
                }
                uVar13 = uVar13 - 1 & uVar13;
              } while (uVar13 != 0);
            }
            if (((&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::
                   is_not_overflowed(unsigned_long)::shift)[(uint)uVar12 & 7] & bStack_2b9) == 0)
            break;
            lVar18 = uVar19 + uVar16;
            uVar16 = uVar16 + 1;
            uVar19 = lVar18 + 1U & *(ulong *)&alreadyExpanded->field_0x58;
          } while (uVar16 <= *(ulong *)&alreadyExpanded->field_0x58);
        }
        if (local_338 == (DefineDirectiveSyntax *)0x0) {
          pDVar15 = (DefineDirectiveSyntax *)0x0;
LAB_00287ac0:
          actualArgs = (MacroActualArgumentListSyntax *)0x0;
        }
        else {
          pDVar15 = local_338;
          if (local_338->formalArguments == (MacroFormalArgumentListSyntax *)0x0) goto LAB_00287ac0;
          actualArgs = MacroParser::parseActualArgumentList(&local_2b8,local_348);
          pDVar15 = local_338;
          if (actualArgs == (MacroActualArgumentListSyntax *)0x0) goto LAB_00287dcd;
        }
        TVar8 = local_348;
        local_260[0].len = 0;
        local_298.sourceManager = this->sourceManager;
        local_298.alloc = this->alloc;
        local_298.dest = local_260;
        local_298.usageSite.kind = local_348.kind;
        local_298.usageSite._2_1_ = local_348._2_1_;
        local_298.usageSite.numFlags.raw = local_348.numFlags.raw;
        local_298.usageSite.rawLen = local_348.rawLen;
        local_298.usageSite.info = local_348.info;
        local_298.any = false;
        local_298.isTopLevel = false;
        MVar27.builtIn = (bool)(undefined1)uStack_32c;
        MVar27.commandLine = (bool)uStack_32c._1_1_;
        MVar27.intrinsic = local_330;
        MVar27._14_2_ = uStack_32a;
        MVar27.syntax = pDVar15;
        local_348 = TVar8;
        bVar9 = expandMacro(this,MVar27,&local_298,actualArgs);
        if (!bVar9) goto LAB_00287dcd;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = local_338;
        uVar16 = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar12 = uVar16 >> (alreadyExpanded->field_0x50 & 0x3f);
        local_318 = *(long *)&alreadyExpanded->field_0x60;
        uVar3 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[uVar16 & 0xff];
        local_320 = *(ulong *)&alreadyExpanded->field_0x58;
        uVar17 = 0;
        uVar19 = uVar12;
        do {
          pcVar1 = (char *)(local_318 + uVar19 * 0x10);
          local_2d8 = *pcVar1;
          cStack_2d7 = pcVar1[1];
          cStack_2d6 = pcVar1[2];
          bStack_2d5 = pcVar1[3];
          cStack_2d4 = pcVar1[4];
          cStack_2d3 = pcVar1[5];
          cStack_2d2 = pcVar1[6];
          bStack_2d1 = pcVar1[7];
          cStack_2d0 = pcVar1[8];
          cStack_2cf = pcVar1[9];
          cStack_2ce = pcVar1[10];
          bStack_2cd = pcVar1[0xb];
          cStack_2cc = pcVar1[0xc];
          cStack_2cb = pcVar1[0xd];
          cStack_2ca = pcVar1[0xe];
          bStack_2c9 = pcVar1[0xf];
          cVar20 = (char)uVar3;
          auVar25[0] = -(local_2d8 == cVar20);
          cVar21 = (char)((uint)uVar3 >> 8);
          auVar25[1] = -(cStack_2d7 == cVar21);
          cVar22 = (char)((uint)uVar3 >> 0x10);
          auVar25[2] = -(cStack_2d6 == cVar22);
          bVar23 = (byte)((uint)uVar3 >> 0x18);
          auVar25[3] = -(bStack_2d5 == bVar23);
          auVar25[4] = -(cStack_2d4 == cVar20);
          auVar25[5] = -(cStack_2d3 == cVar21);
          auVar25[6] = -(cStack_2d2 == cVar22);
          auVar25[7] = -(bStack_2d1 == bVar23);
          auVar25[8] = -(cStack_2d0 == cVar20);
          auVar25[9] = -(cStack_2cf == cVar21);
          auVar25[10] = -(cStack_2ce == cVar22);
          auVar25[0xb] = -(bStack_2cd == bVar23);
          auVar25[0xc] = -(cStack_2cc == cVar20);
          auVar25[0xd] = -(cStack_2cb == cVar21);
          auVar25[0xe] = -(cStack_2ca == cVar22);
          auVar25[0xf] = -(bStack_2c9 == bVar23);
          uVar13 = (uint)(ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe);
          if (uVar13 != 0) {
            do {
              uVar4 = 0;
              if (uVar13 != 0) {
                for (; (uVar13 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                }
              }
              if (local_338 ==
                  *(DefineDirectiveSyntax **)
                   (*(long *)&alreadyExpanded->field_0x68 + uVar19 * 0x78 + (ulong)uVar4 * 8))
              goto LAB_00287c36;
              uVar13 = uVar13 - 1 & uVar13;
            } while (uVar13 != 0);
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar16 & 7] & bStack_2c9) == 0)
          break;
          lVar18 = uVar19 + uVar17;
          uVar17 = uVar17 + 1;
          uVar19 = lVar18 + 1U & local_320;
        } while (uVar17 <= local_320);
        if (*(ulong *)&alreadyExpanded->field_0x78 < *(ulong *)&alreadyExpanded->field_0x70) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
          ::nosize_unchecked_emplace_at<slang::syntax::DefineDirectiveSyntax_const*const&>
                    ((locator *)local_300,local_328,local_310,uVar12,uVar16,&local_338);
          *(long *)&alreadyExpanded->field_0x78 = *(long *)&alreadyExpanded->field_0x78 + 1;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
          ::unchecked_emplace_with_rehash<slang::syntax::DefineDirectiveSyntax_const*const&>
                    ((locator *)local_300,local_328,uVar16,&local_338);
        }
LAB_00287c36:
        local_300._0_8_ = local_260[0].data_;
        local_300._8_8_ = local_260[0].len;
        bVar9 = expandReplacementList
                          (this,(span<const_slang::parsing::Token,_18446744073709551615UL> *)
                                local_300,alreadyExpanded);
        if (!bVar9) goto LAB_00287dcd;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_338;
        uVar12 = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar19 = uVar12 >> (alreadyExpanded->field_0x50 & 0x3f);
        uVar3 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[uVar12 & 0xff];
        uVar16 = 0;
        do {
          pcVar1 = (char *)(*(long *)&alreadyExpanded->field_0x60 + uVar19 * 0x10);
          local_2e8 = *pcVar1;
          cStack_2e7 = pcVar1[1];
          cStack_2e6 = pcVar1[2];
          bStack_2e5 = pcVar1[3];
          cStack_2e4 = pcVar1[4];
          cStack_2e3 = pcVar1[5];
          cStack_2e2 = pcVar1[6];
          bStack_2e1 = pcVar1[7];
          cStack_2e0 = pcVar1[8];
          cStack_2df = pcVar1[9];
          cStack_2de = pcVar1[10];
          bStack_2dd = pcVar1[0xb];
          cStack_2dc = pcVar1[0xc];
          cStack_2db = pcVar1[0xd];
          cStack_2da = pcVar1[0xe];
          bStack_2d9 = pcVar1[0xf];
          cVar20 = (char)uVar3;
          auVar26[0] = -(local_2e8 == cVar20);
          cVar21 = (char)((uint)uVar3 >> 8);
          auVar26[1] = -(cStack_2e7 == cVar21);
          cVar22 = (char)((uint)uVar3 >> 0x10);
          auVar26[2] = -(cStack_2e6 == cVar22);
          bVar23 = (byte)((uint)uVar3 >> 0x18);
          auVar26[3] = -(bStack_2e5 == bVar23);
          auVar26[4] = -(cStack_2e4 == cVar20);
          auVar26[5] = -(cStack_2e3 == cVar21);
          auVar26[6] = -(cStack_2e2 == cVar22);
          auVar26[7] = -(bStack_2e1 == bVar23);
          auVar26[8] = -(cStack_2e0 == cVar20);
          auVar26[9] = -(cStack_2df == cVar21);
          auVar26[10] = -(cStack_2de == cVar22);
          auVar26[0xb] = -(bStack_2dd == bVar23);
          auVar26[0xc] = -(cStack_2dc == cVar20);
          auVar26[0xd] = -(cStack_2db == cVar21);
          auVar26[0xe] = -(cStack_2da == cVar22);
          auVar26[0xf] = -(bStack_2d9 == bVar23);
          uVar13 = (uint)(ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe);
          if (uVar13 != 0) {
            lVar18 = uVar19 * 0x10 + *(long *)&alreadyExpanded->field_0x60;
            do {
              uVar4 = 0;
              if (uVar13 != 0) {
                for (; (uVar13 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                }
              }
              uVar17 = (ulong)uVar4;
              if (local_338 ==
                  *(DefineDirectiveSyntax **)
                   (*(long *)&alreadyExpanded->field_0x68 + uVar19 * 0x78 + uVar17 * 8)) {
                bVar23 = (&boost::unordered::detail::foa::
                           group15<boost::unordered::detail::foa::plain_integral>::
                           is_not_overflowed(unsigned_long)::shift)[*(byte *)(lVar18 + uVar17) & 7];
                bVar2 = *(byte *)(lVar18 + uVar17 | 0xf);
                *(undefined1 *)(lVar18 + uVar17) = 0;
                *(ulong *)&alreadyExpanded->field_0x70 =
                     *(long *)&alreadyExpanded->field_0x70 - (ulong)((bVar23 & bVar2) != 0);
                *(long *)&alreadyExpanded->field_0x78 = *(long *)&alreadyExpanded->field_0x78 + -1;
                goto LAB_00287d68;
              }
              uVar13 = uVar13 - 1 & uVar13;
            } while (uVar13 != 0);
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar12 & 7] & bStack_2d9) == 0)
          break;
          lVar18 = uVar19 + uVar16;
          uVar16 = uVar16 + 1;
          uVar19 = lVar18 + 1U & *(ulong *)&alreadyExpanded->field_0x58;
        } while (uVar16 <= *(ulong *)&alreadyExpanded->field_0x58);
LAB_00287d68:
        SmallVectorBase<slang::parsing::Token>::
        append<__gnu_cxx::__normal_iterator<const_slang::parsing::Token_*,_std::span<const_slang::parsing::Token,_18446744073709551615UL>_>_>
                  (local_148,
                   (__normal_iterator<const_slang::parsing::Token_*,_std::span<const_slang::parsing::Token,_18446744073709551615UL>_>
                    )local_300._0_8_,(Token *)(local_300._0_8_ + local_300._8_8_ * 0x10));
        bVar9 = true;
      }
    }
    else {
      SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                (local_148,&local_348);
    }
  }
  if (bVar9) {
    iVar11 = SmallVectorBase<slang::parsing::Token>::copy
                       (local_148,(EVP_PKEY_CTX *)this->alloc,(EVP_PKEY_CTX *)0x0);
    local_308->_M_ptr = (pointer)CONCAT44(extraout_var,iVar11);
    (local_308->_M_extent)._M_extent_value = extraout_RDX;
  }
LAB_00287dcd:
  if (local_260[0].data_ != (pointer)local_260[0].firstElement) {
    operator_delete(local_260[0].data_);
  }
  if (local_148[0].data_ != (pointer)local_148[0].firstElement) {
    operator_delete(local_148[0].data_);
  }
  return pIVar14 == (Info *)0x0;
}

Assistant:

bool Preprocessor::expandReplacementList(
    std::span<Token const>& tokens, SmallSet<const DefineDirectiveSyntax*, 8>& alreadyExpanded) {

    SmallVector<Token, 16> outBuffer;
    SmallVector<Token, 16> expansionBuffer;

    bool expandedSomething = false;
    MacroParser parser(*this);
    parser.setBuffer(tokens);

    // loop through each token in the replacement list and expand it if it's a nested macro
    Token token;
    while ((token = parser.next())) {
        if (token.kind != TokenKind::Directive || token.directiveKind() != SyntaxKind::MacroUsage) {
            outBuffer.push_back(token);
            continue;
        }

        // lookup the macro definition
        auto macro = findMacro(token);
        if (!macro.valid()) {
            // If we couldn't find the macro, just keep trucking.
            // It's possible that a future expansion will make this valid.
            outBuffer.push_back(token);
            continue;
        }

        if (!macro.isIntrinsic() && alreadyExpanded.count(macro.syntax)) {
            addDiag(diag::RecursiveMacro, token.location()) << token.valueText();
            return false;
        }

        // parse arguments if necessary
        MacroActualArgumentListSyntax* actualArgs = nullptr;
        if (macro.needsArgs()) {
            actualArgs = parser.parseActualArgumentList(token);
            if (!actualArgs)
                return false;
        }

        expansionBuffer.clear();
        MacroExpansion expansion{sourceManager, alloc, expansionBuffer, token, false};
        if (!expandMacro(macro, expansion, actualArgs))
            return false;

        // Recursively expand out nested macros; this ensures that we detect
        // any potentially recursive macros.
        alreadyExpanded.insert(macro.syntax);
        std::span<const Token> expanded = expansionBuffer;
        if (!expandReplacementList(expanded, alreadyExpanded))
            return false;

        alreadyExpanded.erase(macro.syntax);
        outBuffer.append_range(expanded);
        expandedSomething = true;
    }

    // Make a heap copy of the tokens before we leave, if we actually expanded something.
    if (expandedSomething)
        tokens = outBuffer.copy(alloc);
    return true;
}